

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

bool __thiscall Regex::processTerminal(Regex *this,Element *cur_node,ParseData *data)

{
  byte bVar1;
  char *pcVar2;
  Element *local_38;
  Element *child_node;
  bool match;
  bool invert;
  ParseData *data_local;
  Element *cur_node_local;
  Regex *this_local;
  
  if (cur_node->mType == TYPE_TERMINAL) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
    if ((cur_node->mTermStartChar <= *pcVar2) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data),
       *pcVar2 <= cur_node->mTermEndChar)) {
      return true;
    }
  }
  else if (cur_node->mType == TYPE_CLASS) {
    bVar1 = cur_node->mClassInvert & 1;
    local_38 = cur_node->mChild;
    do {
      if (local_38 == (Element *)0x0) {
        if (bVar1 != 0) {
          return true;
        }
        return false;
      }
      if (bVar1 == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
        if ((local_38->mTermStartChar <= *pcVar2) &&
           (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data),
           *pcVar2 <= local_38->mTermEndChar)) {
          return true;
        }
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data);
        if ((local_38->mTermStartChar <= *pcVar2) &&
           (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)data),
           *pcVar2 <= local_38->mTermEndChar)) {
          return false;
        }
      }
      local_38 = local_38->mNext;
    } while( true );
  }
  return false;
}

Assistant:

bool	Regex::processTerminal( Element *cur_node, ParseData *data )
{
	if ( cur_node->mType == TYPE_TERMINAL )
	{
		if ( CUR_CHAR >= cur_node->mTermStartChar && CUR_CHAR <= cur_node->mTermEndChar )
			return true;
	}
	else if ( cur_node->mType == TYPE_CLASS )
	{
		bool invert = cur_node->mClassInvert;
		bool match = invert;
		Element *child_node = cur_node->mChild;
		
		while ( child_node != NULL )
		{
			if ( !invert )
			{
				if ( CUR_CHAR >= child_node->mTermStartChar && CUR_CHAR <= child_node->mTermEndChar )
					return true;
			}
			else
			{
				if ( CUR_CHAR >= child_node->mTermStartChar && CUR_CHAR <= child_node->mTermEndChar )
					return false;
			}
			
			child_node = child_node->mNext;
		}
		
		if ( match )
			return true;
		else
			return false;
	}

	return false;
}